

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::ParseFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  CodedInputStream *input_local;
  UnknownFieldSet *this_local;
  
  Clear(this);
  bVar1 = MergeFromCodedStream(this,input);
  return bVar1;
}

Assistant:

bool UnknownFieldSet::ParseFromCodedStream(io::CodedInputStream* input) {
  Clear();
  return MergeFromCodedStream(input);
}